

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

void __thiscall MetaSim::Event::post(Event *this,Tick myTime,bool disp)

{
  unsigned_long uVar1;
  Simulation *pSVar2;
  Tick TVar3;
  ostream *poVar4;
  BaseExc *pBVar5;
  pair<std::_Rb_tree_iterator<MetaSim::Event_*>,_bool> pVar6;
  stringstream str;
  Tick local_2e8;
  Tick local_2e0;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  Event *local_1b8 [2];
  ostream local_1a8 [376];
  
  local_2e8.v = myTime.v;
  if (this->_isInQueue == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Time: ",6);
    pSVar2 = Simulation::getInstance();
    local_2e0 = Simulation::getTime(pSVar2);
    poVar4 = operator<<(local_1a8,&local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -- Event",9);
    poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                    (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," already posted",0xf);
    pBVar5 = (BaseExc *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Event","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"event.cpp","");
    BaseExc::BaseExc(pBVar5,&local_1d8,&local_238,&local_258);
    *(undefined ***)pBVar5 = &PTR__BaseExc_0017dce8;
    __cxa_throw(pBVar5,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  pSVar2 = Simulation::getInstance();
  TVar3 = Simulation::getTime(pSVar2);
  if (TVar3.v <= local_2e8.v) {
    setTime(this,local_2e8);
    uVar1 = counter + 1;
    this->_order = counter;
    counter = uVar1;
    local_1b8[0] = this;
    pVar6 = std::
            _Rb_tree<MetaSim::Event*,MetaSim::Event*,std::_Identity<MetaSim::Event*>,MetaSim::Event::Cmp,std::allocator<MetaSim::Event*>>
            ::_M_insert_unique<MetaSim::Event*const&>
                      ((_Rb_tree<MetaSim::Event*,MetaSim::Event*,std::_Identity<MetaSim::Event*>,MetaSim::Event::Cmp,std::allocator<MetaSim::Event*>>
                        *)_eventQueue,local_1b8);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->_isInQueue = true;
      this->_disposable = disp;
      (*this->_vptr_Event[3])(this);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Time: ",6);
    pSVar2 = Simulation::getInstance();
    local_2e0 = Simulation::getTime(pSVar2);
    poVar4 = operator<<(local_1a8,&local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -- Posting event",0x11);
    poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                    (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Already in queue!, at time = ",0x1e)
    ;
    operator<<(poVar4,&local_2e8);
    pBVar5 = (BaseExc *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Event","");
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"event.cpp","");
    BaseExc::BaseExc(pBVar5,&local_218,&local_2b8,&local_2d8);
    *(undefined ***)pBVar5 = &PTR__BaseExc_0017dce8;
    __cxa_throw(pBVar5,&Exc::typeinfo,BaseExc::~BaseExc);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Time: ",6);
  pSVar2 = Simulation::getInstance();
  local_2e0 = Simulation::getTime(pSVar2);
  poVar4 = operator<<(local_1a8,&local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," -- Posting event",0x11);
  poVar4 = std::operator<<(poVar4,*(char **)(this->_vptr_Event[-1] + 8) +
                                  (**(char **)(this->_vptr_Event[-1] + 8) == '*'));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in the past at time: ",0x16);
  operator<<(poVar4,&local_2e8);
  pBVar5 = (BaseExc *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Event","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"event.cpp","");
  BaseExc::BaseExc(pBVar5,&local_1f8,&local_278,&local_298);
  *(undefined ***)pBVar5 = &PTR__BaseExc_0017dce8;
  __cxa_throw(pBVar5,&Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void Event::post(Tick myTime, bool disp) throw (Exc, BaseExc)
    {
        if (_isInQueue) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Event" 
                << typeid(*this).name() << " already posted";
            throw Exc(str.str());
        }

        if (myTime < SIMUL.getTime()) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " in the past at time: " 
                << myTime;
            throw Exc(str.str());
        }

        setTime(myTime);

        _order = counter++;

        std::pair<EventQueue::iterator,bool> p;
        p =_eventQueue.insert(this);
    
        if (!p.second) {
            std::stringstream str;
            str << "Time: " << SIMUL.getTime() 
                << " -- Posting event" 
                << typeid(*this).name() << " Already in queue!, at time = " << myTime;
            throw Exc(str.str());
        }

        _isInQueue = true;
        _disposable = disp;

        DBGENTER(_EVENT_DBG_LEV);
        print();
        
    }